

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolj.c
# Opt level: O0

int ffp3dj(fitsfile *fptr,long group,LONGLONG ncols,LONGLONG nrows,LONGLONG naxis1,LONGLONG naxis2,
          LONGLONG naxis3,long *array,int *status)

{
  int iVar1;
  LONGLONG local_b0;
  long local_a8;
  LONGLONG narray;
  LONGLONG nfits;
  long lpixel [3];
  long local_78;
  long fpixel [3];
  long local_58;
  long jj;
  long ii;
  long tablerow;
  LONGLONG naxis2_local;
  LONGLONG naxis1_local;
  LONGLONG nrows_local;
  LONGLONG ncols_local;
  long group_local;
  fitsfile *fptr_local;
  
  local_78 = 1;
  fpixel[0] = 1;
  fpixel[1] = 1;
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 == 0) {
    local_b0 = group;
    if (group < 1) {
      local_b0 = 1;
    }
    if ((ncols == naxis1) && (nrows == naxis2)) {
      ffpclj(fptr,2,local_b0,1,naxis1 * naxis2 * naxis3,array,status);
      fptr_local._4_4_ = *status;
    }
    else if ((ncols < naxis1) || (nrows < naxis2)) {
      *status = 0x140;
      fptr_local._4_4_ = 0x140;
    }
    else {
      narray = 1;
      local_a8 = 0;
      for (local_58 = 0; local_58 < naxis3; local_58 = local_58 + 1) {
        for (jj = 0; jj < naxis2; jj = jj + 1) {
          iVar1 = ffpclj(fptr,2,local_b0,narray,naxis1,array + local_a8,status);
          if (0 < iVar1) {
            return *status;
          }
          narray = naxis1 + narray;
          local_a8 = ncols + local_a8;
        }
        local_a8 = (nrows - naxis2) * ncols + local_a8;
      }
      fptr_local._4_4_ = *status;
    }
  }
  else {
    lpixel[1] = naxis3;
    nfits = ncols;
    lpixel[0] = nrows;
    fits_write_compressed_img(fptr,0x29,&local_78,&nfits,0,array,(void *)0x0,status);
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffp3dj(fitsfile *fptr,   /* I - FITS file pointer                     */
           long  group,      /* I - group to write(1 = 1st group)         */
           LONGLONG  ncols,      /* I - number of pixels in each row of array */
           LONGLONG  nrows,      /* I - number of rows in each plane of array */
           LONGLONG  naxis1,     /* I - FITS image NAXIS1 value               */
           LONGLONG  naxis2,     /* I - FITS image NAXIS2 value               */
           LONGLONG  naxis3,     /* I - FITS image NAXIS3 value               */
           long  *array,     /* I - array to be written                   */
           int  *status)     /* IO - error status                         */
/*
  Write an entire 3-D cube of values to the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of the
  FITS array is not the same as the array being written).
*/
{
    long tablerow, ii, jj;
    long fpixel[3]= {1,1,1}, lpixel[3];
    LONGLONG nfits, narray;
    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */
           
    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */
        lpixel[0] = (long) ncols;
        lpixel[1] = (long) nrows;
        lpixel[2] = (long) naxis3;
       
        fits_write_compressed_img(fptr, TLONG, fpixel, lpixel,
            0,  array, NULL, status);
    
        return(*status);
    }

    tablerow=maxvalue(1,group);

    if (ncols == naxis1 && nrows == naxis2)  /* arrays have same size? */
    {
      /* all the image pixels are contiguous, so write all at once */
      ffpclj(fptr, 2, tablerow, 1L, naxis1 * naxis2 * naxis3, array, status);
      return(*status);
    }

    if (ncols < naxis1 || nrows < naxis2)
       return(*status = BAD_DIMEN);

    nfits = 1;   /* next pixel in FITS image to write to */
    narray = 0;  /* next pixel in input array to be written */

    /* loop over naxis3 planes in the data cube */
    for (jj = 0; jj < naxis3; jj++)
    {
      /* loop over the naxis2 rows in the FITS image, */
      /* writing naxis1 pixels to each row            */

      for (ii = 0; ii < naxis2; ii++)
      {
       if (ffpclj(fptr, 2, tablerow, nfits, naxis1,&array[narray],status) > 0)
         return(*status);

       nfits += naxis1;
       narray += ncols;
      }
      narray += (nrows - naxis2) * ncols;
    }
    return(*status);
}